

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O0

int space_mixer_start(mixed_segment *segment)

{
  int local_24;
  int i;
  space_mixer_data *data;
  mixed_segment *segment_local;
  
  local_24 = 0;
  while( true ) {
    if ((int)(uint)*(byte *)((long)segment->data + 0x542c) <= local_24) {
      return 1;
    }
    if (*(long *)(*(long *)((long)segment->data + 0x10) + (long)local_24 * 8) == 0) break;
    local_24 = local_24 + 1;
  }
  mixed_err(0x16);
  return 0;
}

Assistant:

int space_mixer_start(struct mixed_segment *segment){
  struct space_mixer_data *data = (struct space_mixer_data *)segment->data;
  for(int i=0; i<data->channels.count; ++i){
    if(!data->out[i]){
      mixed_err(MIXED_BUFFER_MISSING);
      return 0;
    }
  }
  return 1;
}